

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O1

bool __thiscall LTOnlineChannel::FetchAllData(LTOnlineChannel *this,positionTy *pos)

{
  long lVar1;
  float fVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  logLevelTy lvl;
  float fVar7;
  string url;
  string local_50;
  
  iVar4 = (*(this->super_LTChannel)._vptr_LTChannel[0x12])();
  if ((char)iVar4 == '\0') {
    return false;
  }
  (*(this->super_LTChannel)._vptr_LTChannel[0x14])(&url,this,pos);
  fVar2 = FetchAllData::tLastMsg;
  if (url._M_string_length != 0) {
    (*(this->super_LTChannel)._vptr_LTChannel[0x15])(this,pos);
    curl_easy_setopt(this->pCurl,0x2712,url._M_dataplus._M_p);
    curl_easy_setopt(this->pCurl,0x62,this->netDataSize);
    curl_easy_setopt(this->pCurl,0xd,dataRefs.netwTimeoutMax);
    curl_easy_setopt(this->pCurl,0x2c,0);
    if ((this->requBody)._M_string_length == 0) {
      curl_easy_setopt(this->pCurl,0x50,1);
    }
    else {
      curl_easy_setopt(this->pCurl,0x271f,(this->requBody)._M_dataplus._M_p);
    }
    this->netDataPos = 0;
    *this->netData = '\0';
    DebugLogRaw(this,url._M_dataplus._M_p,-1,true);
    if ((this->requBody)._M_string_length != 0) {
      DebugLogRaw(this,(this->requBody)._M_dataplus._M_p,-1,false);
    }
    std::chrono::_V2::steady_clock::now();
    this->httpResponse = 0;
    uVar5 = curl_easy_perform(this->pCurl);
    std::chrono::_V2::steady_clock::now();
    if (uVar5 == 0) {
      bVar3 = false;
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      sVar6 = strlen(this->curl_errtxt);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,this->curl_errtxt,this->curl_errtxt + sVar6);
      bVar3 = IsRevocationError(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar3 != false) {
      curl_easy_setopt(this->pCurl,0xd8,2);
      if ((int)dataRefs.iLogLevel < 3) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
               ,0x31c,"FetchAllData",logWARN,
               "%s: Querying revocation list failed - have set CURLSSLOPT_NO_REVOKE and am trying again"
               ,(this->super_LTChannel).pszChName);
      }
      std::chrono::_V2::steady_clock::now();
      uVar5 = curl_easy_perform(this->pCurl);
      std::chrono::_V2::steady_clock::now();
    }
    if (uVar5 == 0) {
      curl_easy_getinfo(this->pCurl,0x200002,&this->httpResponse);
      lVar1 = this->httpResponse;
      if (lVar1 != 200) {
        if (lVar1 == 0x194) {
          if ((int)dataRefs.iLogLevel < 1) {
            lvl = logDEBUG;
            iVar4 = 0x33f;
LAB_00168dd9:
            LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
                   ,iVar4,"FetchAllData",lvl,"%s: HTTP response is not OK but %ld for %s",
                   (this->super_LTChannel).pszChName,lVar1,url._M_dataplus._M_p);
          }
        }
        else if ((int)dataRefs.iLogLevel < 3) {
          lvl = logWARN;
          iVar4 = 0x344;
          goto LAB_00168dd9;
        }
      }
      bVar3 = true;
      DebugLogRaw(this,this->netData,this->httpResponse,true);
      goto LAB_00168e21;
    }
    if (uVar5 == 0x1c) {
      fVar7 = DataRefs::GetMiscNetwTime(&dataRefs);
      fVar2 = FetchAllData::tLastMsg;
      if ((FetchAllData::tLastMsg + 180.0 < fVar7) && (fVar2 = fVar7, (int)dataRefs.iLogLevel < 3))
      {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
               ,0x32c,"FetchAllData",logWARN,"%s: Could not get network data: %d - %s",
               (this->super_LTChannel).pszChName,0x1c,this->curl_errtxt);
      }
    }
    else {
      if ((int)dataRefs.iLogLevel < 4) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
               ,0x330,"FetchAllData",logERR,"%s: Could not get network data: %d - %s",
               (this->super_LTChannel).pszChName,(ulong)uVar5,this->curl_errtxt);
      }
      CreateMsgWindow(12.0,logERR,"%s: Could not get network data: %d - %s",
                      (this->super_LTChannel).pszChName,(ulong)uVar5,this->curl_errtxt);
      (*(this->super_LTChannel)._vptr_LTChannel[8])(this);
      fVar2 = FetchAllData::tLastMsg;
    }
  }
  FetchAllData::tLastMsg = fVar2;
  bVar3 = false;
LAB_00168e21:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)url._M_dataplus._M_p != &url.field_2) {
    operator_delete(url._M_dataplus._M_p,url.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool LTOnlineChannel::FetchAllData (const positionTy& pos)
{
    CURLcode cc = CURLE_OK;

    // make sure CURL is initialized
    if ( !InitCurl() ) return false;
    
    // ask for the URL
    std::string url (GetURL(pos));
    
    // no url -> don't query
    if (url.empty())
        return false;
    
    // ask for a body of a POST request (to be put into requBody)
    ComputeBody(pos);
    
    // put together the REST request
    curl_easy_setopt(pCurl, CURLOPT_URL, url.c_str());
    curl_easy_setopt(pCurl, CURLOPT_BUFFERSIZE, netDataSize );
    curl_easy_setopt(pCurl, CURLOPT_TIMEOUT, dataRefs.GetNetwTimeoutMax());

    // Set up the request
    curl_easy_setopt(pCurl, CURLOPT_NOBODY,  0);
    if (requBody.empty())
        // HTTPS GET
        curl_easy_setopt(pCurl, CURLOPT_HTTPGET, 1);
    else
        // HTTPS POST
        curl_easy_setopt(pCurl, CURLOPT_POSTFIELDS, requBody.data());
    
    // get fresh data via the internet
    // this will take a second or more...don't try in render loop ;)
    // it is assumed that this is called in a separate thread,
    // hence we can use the simple blocking curl_easy_ call
    netDataPos = 0;                 // fill buffer from beginning
    netData[0] = 0;
    DebugLogRaw(url.c_str(), HTTP_FLAG_SENDING);
    if (!requBody.empty())
        DebugLogRaw(requBody.c_str(), HTTP_FLAG_SENDING, false);
    
    // perform the request and take its time
    std::chrono::time_point<std::chrono::steady_clock> tStart = std::chrono::steady_clock::now();
    httpResponse = 0;
    cc=curl_easy_perform(pCurl);
    std::chrono::time_point<std::chrono::steady_clock> tEnd = std::chrono::steady_clock::now();

    // Give it another try in case of revocation list issues
    if ( cc != CURLE_OK && IsRevocationError(curl_errtxt)) {
        // try not to query revoke list
        curl_easy_setopt(pCurl, CURLOPT_SSL_OPTIONS, CURLSSLOPT_NO_REVOKE);
        LOG_MSG(logWARN, ERR_CURL_DISABLE_REV_QU, ChName());
        // and just give it another try
        tStart = std::chrono::steady_clock::now();
        cc = curl_easy_perform(pCurl);
        tEnd = std::chrono::steady_clock::now();
    }

    // if (still) error, then log error and bail out
    if (cc != CURLE_OK) {
        
        // In case of timeout increase the channel's timeout and don't count it as an error
        if (cc == CURLE_OPERATION_TIMEDOUT) {
            // But bother the user only with messages once every 3 minutes (this is due to OpenSky having been plagued with slow API responses running into timeouts)
            static float tLastMsg = 0.0f;                   // time last message was logged
            const float now = dataRefs.GetMiscNetwTime();
            if (tLastMsg + 180.0f < now) {
                LOG_MSG(logWARN, ERR_CURL_PERFORM, ChName(), cc, curl_errtxt);
                tLastMsg = now;
            }
        } else {
            SHOW_MSG(logERR, ERR_CURL_PERFORM, ChName(), cc, curl_errtxt);
            IncErrCnt();
        }
        
        return false;
    }

    // check HTTP response code
    curl_easy_getinfo(pCurl, CURLINFO_RESPONSE_CODE, &httpResponse);
    switch (httpResponse) {
        case HTTP_OK:
            break;

        case HTTP_NOT_FOUND:
            // not found is typically handled separately, so only debug-level
            LOG_MSG(logDEBUG,ERR_CURL_HTTP_RESP,ChName(),httpResponse, url.c_str());
            break;
            
        default:
            // all other responses are warnings
            LOG_MSG(logWARN,ERR_CURL_HTTP_RESP,ChName(),httpResponse, url.c_str());
    }
    
    // if requested log raw data received
    DebugLogRaw(netData, httpResponse);
    
    // success
    return true;
}